

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

void __thiscall soul::CodeLocation::throwError(CodeLocation *this,CompileMessage *message)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  pointer pcVar3;
  CompileMessage local_58;
  
  pSVar1 = (this->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pcVar2 = (this->location).data;
  local_58.description._M_dataplus._M_p = (pointer)&local_58.description.field_2;
  pcVar3 = (message->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (message->description)._M_string_length);
  local_58.type = message->type;
  local_58.category = none;
  local_58.location.sourceCode.object = pSVar1;
  local_58.location.location.data = pcVar2;
  soul::throwError(&local_58);
}

Assistant:

[[noreturn]] void CodeLocation::throwError (CompileMessage message) const
{
    soul::throwError (message.withLocation (*this));
}